

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ruby_generator.cc
# Opt level: O2

int google::protobuf::compiler::ruby::GeneratePackageModules(string *package_name,Printer *printer)

{
  long lVar1;
  int iVar2;
  string component;
  string local_50;
  
  iVar2 = 0;
  while (package_name->_M_string_length != 0) {
    lVar1 = std::__cxx11::string::find((char *)package_name,0x34f683);
    component._M_dataplus._M_p = (pointer)&component.field_2;
    component._M_string_length = 0;
    component.field_2._M_local_buf[0] = '\0';
    if (lVar1 == -1) {
      std::__cxx11::string::_M_assign((string *)&component);
      std::__cxx11::string::assign((char *)package_name);
    }
    else {
      std::__cxx11::string::substr((ulong)&local_50,(ulong)package_name);
      std::__cxx11::string::operator=((string *)&component,(string *)&local_50);
      std::__cxx11::string::~string((string *)&local_50);
      std::__cxx11::string::substr((ulong)&local_50,(ulong)package_name);
      std::__cxx11::string::operator=((string *)package_name,(string *)&local_50);
      std::__cxx11::string::~string((string *)&local_50);
    }
    PackageToModule(&local_50,&component);
    std::__cxx11::string::operator=((string *)&component,(string *)&local_50);
    std::__cxx11::string::~string((string *)&local_50);
    io::Printer::Print(printer,"module $name$\n","name",&component);
    io::Printer::Indent(printer);
    iVar2 = iVar2 + 1;
    std::__cxx11::string::~string((string *)&component);
  }
  return iVar2;
}

Assistant:

int GeneratePackageModules(
    std::string package_name,
    google::protobuf::io::Printer* printer) {
  int levels = 0;
  while (!package_name.empty()) {
    size_t dot_index = package_name.find(".");
    string component;
    if (dot_index == string::npos) {
      component = package_name;
      package_name = "";
    } else {
      component = package_name.substr(0, dot_index);
      package_name = package_name.substr(dot_index + 1);
    }
    component = PackageToModule(component);
    printer->Print(
      "module $name$\n",
      "name", component);
    printer->Indent();
    levels++;
  }
  return levels;
}